

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O3

void __thiscall DrawerCommandQueue::StopThreads(DrawerCommandQueue *this)

{
  pointer pDVar1;
  pointer pDVar2;
  DrawerThread *thread;
  pointer pDVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->start_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this->shutdown_flag = true;
  std::unique_lock<std::mutex>::unlock(&local_28);
  std::condition_variable::notify_all();
  pDVar3 = (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar3 != pDVar1) {
    do {
      std::thread::join();
      pDVar3 = pDVar3 + 1;
    } while (pDVar3 != pDVar1);
    pDVar3 = (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl
             .super__Vector_impl_data._M_start;
    pDVar1 = (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pDVar2 = pDVar3;
    if (pDVar1 != pDVar3) {
      do {
        if ((pDVar2->thread)._M_id._M_thread != 0) {
          std::terminate();
        }
        pDVar2 = pDVar2 + 1;
      } while (pDVar2 != pDVar1);
      (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
      super__Vector_impl_data._M_finish = pDVar3;
    }
  }
  std::unique_lock<std::mutex>::lock(&local_28);
  this->shutdown_flag = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void DrawerCommandQueue::StopThreads()
{
	std::unique_lock<std::mutex> lock(start_mutex);
	shutdown_flag = true;
	lock.unlock();
	start_condition.notify_all();
	for (auto &thread : threads)
		thread.thread.join();
	threads.clear();
	lock.lock();
	shutdown_flag = false;
}